

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  result_type_conflict2 *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  double sigma;
  double mu;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  param_type local_38;
  char local_27;
  char local_26;
  char local_25;
  fmtflags local_24;
  result_type_conflict2 local_20;
  result_type_conflict2 local_18;
  result_type_conflict2 *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  in_00 = local_8;
  local_25 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(in_00,(delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_18);
  local_26 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(in_00,(delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_20);
  local_27 = (char)utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    lognormal_dist<double>::param_type::param_type(&local_38,local_18,local_20);
    *local_10 = local_38.mu_;
    local_10[1] = local_38.sigma_;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_24);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma);
        in.flags(flags);
        return in;
      }